

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupLevelized(Gia_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *__ptr;
  void *__ptr_00;
  ulong uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  long lVar13;
  long lVar14;
  
  iVar5 = Gia_ManLevelNum(p);
  __ptr = (int *)calloc((long)(int)(iVar5 + 1U),4);
  __ptr_00 = malloc((long)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) << 2);
  uVar8 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar7 = *(uint *)(&p->pObjs->field_0x0 + lVar13);
      if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
        if ((int)uVar8 <= lVar14) goto LAB_001f0644;
        pVVar11 = p->vLevels;
        Vec_IntFillExtra(pVVar11,(int)lVar14 + 1,0);
        if (pVVar11->nSize <= lVar14) goto LAB_001f06a1;
        __ptr[pVVar11->pArray[lVar14]] = __ptr[pVVar11->pArray[lVar14]] + 1;
      }
      lVar14 = lVar14 + 1;
      uVar8 = (ulong)p->nObjs;
      lVar13 = lVar13 + 0xc;
    } while (lVar14 < (long)uVar8);
  }
  if (0 < iVar5) {
    iVar6 = *__ptr;
    uVar8 = 1;
    do {
      iVar6 = iVar6 + __ptr[uVar8];
      __ptr[uVar8] = iVar6;
      uVar8 = uVar8 + 1;
    } while (iVar5 + 1U != uVar8);
  }
  uVar7 = p->nObjs;
  uVar8 = (ulong)uVar7;
  if (0 < (int)uVar7) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      uVar7 = (uint)uVar8;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(&p->pObjs->field_0x0 + lVar13);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        if ((int)uVar7 <= lVar14) goto LAB_001f0644;
        pVVar11 = p->vLevels;
        Vec_IntFillExtra(pVVar11,(int)lVar14 + 1,0);
        if (pVVar11->nSize <= lVar14) {
LAB_001f06a1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = __ptr[(long)pVVar11->pArray[lVar14] + -1];
        __ptr[(long)pVVar11->pArray[lVar14] + -1] = iVar5 + 1;
        *(int *)((long)__ptr_00 + (long)iVar5 * 4) = (int)lVar14;
      }
      lVar14 = lVar14 + 1;
      uVar7 = p->nObjs;
      uVar8 = (ulong)(int)uVar7;
      lVar13 = lVar13 + 0xc;
    } while (lVar14 < (long)uVar8);
  }
  p_00 = Gia_ManStart(uVar7);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pName = pcVar10;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar2);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar2);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar13];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001f0663;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar12 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar12)) {
LAB_001f0644:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar12 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar12)) goto LAB_001f0644;
      pGVar3[iVar5].Value = (int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      pVVar11 = p->vCis;
    } while (lVar13 < pVVar11->nSize);
  }
  iVar5 = p->nObjs;
  if ((p->vCos->nSize + p->vCis->nSize) - iVar5 < -1) {
    lVar13 = 0;
    do {
      iVar6 = *(int *)((long)__ptr_00 + lVar13 * 4);
      if (((long)iVar6 < 0) || (iVar5 <= iVar6)) goto LAB_001f0663;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar6;
      uVar8 = *(ulong *)pGVar3;
      if (((int)pGVar3[-(ulong)((uint)uVar8 & 0x1fffffff)].Value < 0) ||
         (uVar7 = (uint)(uVar8 >> 0x20), (int)pGVar3[-(ulong)(uVar7 & 0x1fffffff)].Value < 0))
      goto LAB_001f0682;
      uVar7 = Gia_ManAppendAnd(p_00,(uint)(uVar8 >> 0x1d) & 1 ^
                                    pGVar3[-(ulong)((uint)uVar8 & 0x1fffffff)].Value,
                               pGVar3[-(ulong)(uVar7 & 0x1fffffff)].Value ^ uVar7 >> 0x1d & 1);
      pGVar3->Value = uVar7;
      lVar13 = lVar13 + 1;
      iVar5 = p->nObjs;
    } while (lVar13 < ~(p->vCos->nSize + p->vCis->nSize) + iVar5);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar13];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_001f0663:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001f0682:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar7 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                   pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value)
      ;
      pGVar3->Value = uVar7;
      lVar13 = lVar13 + 1;
      pVVar11 = p->vCos;
    } while (lVar13 < pVVar11->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupLevelized( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nLevels = Gia_ManLevelNum( p );
    int * pCounts = ABC_CALLOC( int, nLevels + 1 );
    int * pNodes = ABC_ALLOC( int, Gia_ManAndNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pCounts[Gia_ObjLevel(p, pObj)]++;
    for ( i = 1; i <= nLevels; i++ )
        pCounts[i] += pCounts[i-1];
    Gia_ManForEachAnd( p, pObj, i )
        pNodes[pCounts[Gia_ObjLevel(p, pObj)-1]++] = i;
    // duplicate
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( i = 0; i < Gia_ManAndNum(p) && (pObj = Gia_ManObj(p, pNodes[i])); i++ )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( pCounts );
    ABC_FREE( pNodes );
    return pNew;
}